

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

void init_run(validator_mq_msg *msg)

{
  int iVar1;
  int local_1c;
  int local_18;
  int pipe_dsc [2];
  int tmp_err;
  validator_mq_msg *msg_local;
  
  pipe_dsc[0] = 0;
  unique0x100000a5 = msg;
  pipe_dsc[0] = pipe(&local_1c);
  if (((err & 1U) == 0) && (pipe_dsc[0] != -1)) {
    async_create_run(&local_1c);
    pipe_dsc[0] = close(local_1c);
    if (((err & 1U) == 0) && (pipe_dsc[0] != -1)) {
      async_pipe_data(&local_1c,&a,stack0xfffffffffffffff0);
      iVar1 = close(local_18);
      if (((err & 1U) != 0) || (iVar1 == -1)) {
        err = true;
      }
    }
    else {
      err = true;
      close(local_18);
    }
  }
  else {
    err = true;
  }
  return;
}

Assistant:

static void init_run(const validator_mq_msg *msg) {
    assert(msg != NULL);

    int tmp_err = 0;
    int pipe_dsc[2];
    tmp_err = pipe(pipe_dsc);
    if(err || tmp_err == -1) {
        err = true;
        return;
    }

    async_create_run(pipe_dsc);
    tmp_err = close(pipe_dsc[0]);
    if(err || tmp_err == -1) {
        err = true;
        close(pipe_dsc[1]);
        return;
    }

    async_pipe_data(pipe_dsc, &a, msg);
    tmp_err = close(pipe_dsc[1]);
    if(err || tmp_err == -1) {
        err = true;
        return;
    }
}